

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Command.h
# Opt level: O1

void __thiscall
IndexFromCommand::IndexFromCommand
          (IndexFromCommand *this,string *path_list_fname,
          vector<IndexType,_std::allocator<IndexType>_> *types,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *taints,bool ensure_unique)

{
  pointer pcVar1;
  
  (this->path_list_fname_)._M_dataplus._M_p = (pointer)&(this->path_list_fname_).field_2;
  pcVar1 = (path_list_fname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + path_list_fname->_M_string_length);
  std::vector<IndexType,_std::allocator<IndexType>_>::vector(&this->types_,types);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&(this->taints_)._M_t,&taints->_M_t);
  this->ensure_unique_ = ensure_unique;
  return;
}

Assistant:

IndexFromCommand(const std::string &path_list_fname,
                     const std::vector<IndexType> &types,
                     std::set<std::string> taints, bool ensure_unique)
        : path_list_fname_(path_list_fname),
          types_(types),
          taints_(taints),
          ensure_unique_(ensure_unique) {}